

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# override.cc
# Opt level: O0

bool __thiscall Override::hasDeadcodeDelay(Override *this,AddrSpace *spc)

{
  int iVar1;
  int4 iVar2;
  size_type sVar3;
  const_reference pvVar4;
  int4 val;
  int4 index;
  AddrSpace *spc_local;
  Override *this_local;
  
  iVar2 = AddrSpace::getIndex(spc);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->deadcodedelay);
  if ((ulong)(long)iVar2 < sVar3) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->deadcodedelay,(long)iVar2);
    iVar1 = *pvVar4;
    if (iVar1 == -1) {
      this_local._7_1_ = false;
    }
    else {
      iVar2 = AddrSpace::getDeadcodeDelay(spc);
      this_local._7_1_ = iVar1 != iVar2;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Override::hasDeadcodeDelay(AddrSpace *spc) const

{
  int4 index = spc->getIndex();
  if (index >= deadcodedelay.size())
    return false;
  int4 val = deadcodedelay[index];
  if (val == -1) return false;
  return (val != spc->getDeadcodeDelay());
}